

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualfilesystem.cpp
# Opt level: O2

void __thiscall
sai::VirtualFileSystem::IterateFATBlock
          (VirtualFileSystem *this,size_t PageIndex,VirtualFileVisitor *Visitor)

{
  EntryType EVar1;
  size_t PageIndex_00;
  long lVar2;
  ulong PageIndex_01;
  long lVar3;
  __weak_ptr<sai::ifstream,(__gnu_cxx::_Lock_policy)2> local_2040 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_2038;
  VirtualPage TablePage;
  VirtualPage CurPage;
  
  lVar3 = 0;
  memset(&CurPage,0,0x1000);
  Read<sai::VirtualPage>(this,PageIndex << 0xc,&CurPage);
  do {
    if ((lVar3 == 0x1000) || (((FATEntry *)((long)&CurPage + lVar3))->Flags == 0)) {
      memset(&TablePage,0,0x1000);
      Read<sai::VirtualPage>(this,PageIndex << 0xc & 0xffffffffffe00000,&TablePage);
      PageIndex_01 = (ulong)*(uint *)((long)&TablePage + (ulong)((uint)PageIndex & 0x1ff) * 8 + 4);
      if (PageIndex_01 != 0) {
        IterateFATBlock(this,PageIndex_01,Visitor);
      }
      return;
    }
    std::__weak_ptr<sai::ifstream,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<sai::ifstream,void>
              (local_2040,(__shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2> *)this);
    VirtualFileEntry::VirtualFileEntry
              ((VirtualFileEntry *)&TablePage.u8,(weak_ptr<sai::ifstream> *)local_2040,
               (FATEntry *)((long)&CurPage + lVar3));
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_2038);
    EVar1 = VirtualFileEntry::GetType((VirtualFileEntry *)&TablePage.u8);
    if (EVar1 == Folder) {
      (**(code **)(*(long *)Visitor + 0x10))(Visitor,&TablePage);
      PageIndex_00 = VirtualFileEntry::GetPageIndex((VirtualFileEntry *)&TablePage.u8);
      IterateFATBlock(this,PageIndex_00,Visitor);
      lVar2 = 0x18;
LAB_001081d5:
      (**(code **)(*(long *)Visitor + lVar2))(Visitor);
    }
    else {
      lVar2 = 0x20;
      if (EVar1 == File) goto LAB_001081d5;
    }
    VirtualFileEntry::~VirtualFileEntry((VirtualFileEntry *)&TablePage.u8);
    lVar3 = lVar3 + 0x40;
  } while( true );
}

Assistant:

void VirtualFileSystem::IterateFATBlock(std::size_t PageIndex, VirtualFileVisitor& Visitor)
{
	VirtualPage CurPage = {};
	Read(PageIndex * VirtualPage::PageSize, CurPage);

	for( const FATEntry& CurFATEntry : CurPage.FATEntries )
	{
		if( !CurFATEntry.Flags )
		{
			break;
		}

		VirtualFileEntry CurEntry(FileStream, CurFATEntry);
		switch( CurEntry.GetType() )
		{
		case FATEntry::EntryType::File:
		{
			Visitor.VisitFile(CurEntry);
			break;
		}
		case FATEntry::EntryType::Folder:
		{
			Visitor.VisitFolderBegin(CurEntry);
			IterateFATBlock(CurEntry.GetPageIndex(), Visitor);
			Visitor.VisitFolderEnd(CurEntry);
			break;
		}
		}
	}

	VirtualPage TablePage = {};
	Read(VirtualPage::NearestTableIndex(PageIndex) * VirtualPage::PageSize, TablePage);

	if( TablePage.PageEntries[PageIndex % VirtualPage::TableSpan].NextPageIndex )
	{
		IterateFATBlock(
			TablePage.PageEntries[PageIndex % VirtualPage::TableSpan].NextPageIndex, Visitor
		);
	}
}